

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O1

void rlNormal3f(float x,float y,float z)

{
  bool bVar1;
  bool bVar2;
  float normalx;
  float fVar3;
  float fVar4;
  float normaly;
  float normalz;
  float fVar5;
  
  fVar5 = y;
  fVar3 = x;
  if (RLGL.State.transformRequired) {
    fVar3 = RLGL.State.transform.m8 * z + RLGL.State.transform.m0 * x + RLGL.State.transform.m4 * y;
    fVar5 = RLGL.State.transform.m9 * z + RLGL.State.transform.m1 * x + RLGL.State.transform.m5 * y;
    z = z * RLGL.State.transform.m10 + x * RLGL.State.transform.m2 + y * RLGL.State.transform.m6;
  }
  fVar4 = z * z + fVar3 * fVar3 + fVar5 * fVar5;
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  bVar1 = NAN(fVar4);
  bVar2 = fVar4 == 0.0;
  fVar4 = 1.0 / fVar4;
  RLGL.State.normalz = z * fVar4;
  if ((bVar2) && (!bVar1)) {
    RLGL.State.normalz = z;
  }
  RLGL.State.normaly = fVar5 * fVar4;
  if ((bVar2) && (!bVar1)) {
    RLGL.State.normaly = fVar5;
  }
  RLGL.State.normalx = fVar4 * fVar3;
  if ((bVar2) && (!bVar1)) {
    RLGL.State.normalx = fVar3;
  }
  return;
}

Assistant:

void rlNormal3f(float x, float y, float z)
{
    float normalx = x;
    float normaly = y;
    float normalz = z;
    if (RLGL.State.transformRequired)
    {
        normalx = RLGL.State.transform.m0*x + RLGL.State.transform.m4*y + RLGL.State.transform.m8*z;
        normaly = RLGL.State.transform.m1*x + RLGL.State.transform.m5*y + RLGL.State.transform.m9*z;
        normalz = RLGL.State.transform.m2*x + RLGL.State.transform.m6*y + RLGL.State.transform.m10*z;
    }
    float length = sqrtf(normalx*normalx + normaly*normaly + normalz*normalz);
    if (length != 0.0f)
    {
        float ilength = 1.0f/length;
        normalx *= ilength;
        normaly *= ilength;
        normalz *= ilength;
    }
    RLGL.State.normalx = normalx;
    RLGL.State.normaly = normaly;
    RLGL.State.normalz = normalz;
}